

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::copy_example_data(example *dst,example *src,int oas)

{
  int in_EDX;
  v_array<unsigned_int> *in_RSI;
  v_array<unsigned_int> *in_RDI;
  undefined4 unaff_retaddr;
  
  if (in_EDX == 0) {
    memcpy(&in_RDI[0x341]._end,&in_RSI[0x341]._end,0x28);
    *(undefined4 *)&in_RDI[0x341]._end = *(undefined4 *)&in_RSI[0x341]._end;
  }
  else {
    v_array<unsigned_int>::delete_v(in_RSI);
    copy_array<unsigned_int>((v_array<unsigned_int> *)CONCAT44(oas,unaff_retaddr),in_RDI);
  }
  VW::copy_example_data(dst._7_1_,src,(example *)CONCAT44(oas,unaff_retaddr));
  return;
}

Assistant:

void copy_example_data(example* dst, example* src, int oas = false) //copy example data. 
    { 
        if (oas == false){
            dst->l = src->l;
            dst->l.multi.label = src->l.multi.label;
        }
        else{
            dst->l.multilabels.label_v.delete_v();
            copy_array(dst->l.multilabels.label_v, src->l.multilabels.label_v);
        }
        VW::copy_example_data(false, dst, src);
    }